

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSchemaGetValidErrors(void)

{
  int iVar1;
  int iVar2;
  xmlSchemaValidCtxtPtr val;
  void **val_00;
  int local_54;
  int n_ctx;
  void **ctx;
  int n_warn;
  xmlSchemaValidityWarningFunc *warn;
  int n_err;
  xmlSchemaValidityErrorFunc *err;
  int n_ctxt;
  xmlSchemaValidCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (err._4_4_ = 0; (int)err._4_4_ < 1; err._4_4_ = err._4_4_ + 1) {
    for (warn._4_4_ = 0; (int)warn._4_4_ < 1; warn._4_4_ = warn._4_4_ + 1) {
      for (ctx._4_4_ = 0; (int)ctx._4_4_ < 1; ctx._4_4_ = ctx._4_4_ + 1) {
        for (local_54 = 0; local_54 < 1; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlSchemaValidCtxtPtr(err._4_4_,0);
          val_00 = gen_void_ptr_ptr(local_54,3);
          iVar2 = xmlSchemaGetValidErrors(val,0,0,val_00);
          desret_int(iVar2);
          call_tests = call_tests + 1;
          des_xmlSchemaValidCtxtPtr(err._4_4_,val,0);
          des_void_ptr_ptr(local_54,val_00,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaGetValidErrors",(ulong)(uint)(iVar2 - iVar1)
                  );
            ret_val = ret_val + 1;
            printf(" %d",(ulong)err._4_4_);
            printf(" %d",(ulong)warn._4_4_);
            printf(" %d",(ulong)ctx._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSchemaGetValidErrors(void) {
    int test_ret = 0;

#if defined(LIBXML_SCHEMAS_ENABLED)
    int mem_base;
    int ret_val;
    xmlSchemaValidCtxtPtr ctxt; /* a XML-Schema validation context */
    int n_ctxt;
    xmlSchemaValidityErrorFunc * err; /* the error function result */
    int n_err;
    xmlSchemaValidityWarningFunc * warn; /* the warning function result */
    int n_warn;
    void ** ctx; /* the functions context result */
    int n_ctx;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlSchemaValidCtxtPtr;n_ctxt++) {
    for (n_err = 0;n_err < gen_nb_xmlSchemaValidityErrorFunc_ptr;n_err++) {
    for (n_warn = 0;n_warn < gen_nb_xmlSchemaValidityWarningFunc_ptr;n_warn++) {
    for (n_ctx = 0;n_ctx < gen_nb_void_ptr_ptr;n_ctx++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlSchemaValidCtxtPtr(n_ctxt, 0);
        err = gen_xmlSchemaValidityErrorFunc_ptr(n_err, 1);
        warn = gen_xmlSchemaValidityWarningFunc_ptr(n_warn, 2);
        ctx = gen_void_ptr_ptr(n_ctx, 3);

        ret_val = xmlSchemaGetValidErrors(ctxt, err, warn, ctx);
        desret_int(ret_val);
        call_tests++;
        des_xmlSchemaValidCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlSchemaValidityErrorFunc_ptr(n_err, err, 1);
        des_xmlSchemaValidityWarningFunc_ptr(n_warn, warn, 2);
        des_void_ptr_ptr(n_ctx, ctx, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSchemaGetValidErrors",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_err);
            printf(" %d", n_warn);
            printf(" %d", n_ctx);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}